

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  ptls_raw_extension_t *ppVar2;
  uint8_t *puVar3;
  size_t sVar4;
  size_t sVar5;
  size_t delta;
  int iVar6;
  size_t sVar7;
  
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     (ppVar2 = properties->additional_extensions, ppVar2 != (ptls_raw_extension_t *)0x0)) {
    uVar1 = ppVar2->type;
    while (uVar1 != 0xffff) {
      iVar6 = ptls_buffer_reserve(sendbuf,2);
      if (iVar6 != 0) {
        return iVar6;
      }
      *(ushort *)(sendbuf->base + sendbuf->off) = uVar1 << 8 | uVar1 >> 8;
      sendbuf->off = sendbuf->off + 2;
      iVar6 = ptls_buffer_reserve(sendbuf,2);
      if (iVar6 != 0) {
        return iVar6;
      }
      puVar3 = sendbuf->base;
      sVar4 = sendbuf->off;
      (puVar3 + sVar4)[0] = '\0';
      (puVar3 + sVar4)[1] = '\0';
      sVar5 = sendbuf->off;
      sVar4 = sVar5 + 2;
      sendbuf->off = sVar4;
      delta = (ppVar2->data).len;
      sVar7 = sVar4;
      if (delta != 0) {
        puVar3 = (ppVar2->data).base;
        iVar6 = ptls_buffer_reserve(sendbuf,delta);
        if (iVar6 != 0) {
          return iVar6;
        }
        memcpy(sendbuf->base + sendbuf->off,puVar3,delta);
        sVar7 = delta + sendbuf->off;
        sendbuf->off = sVar7;
      }
      sendbuf->base[sVar5] = (uint8_t)(sVar7 - sVar4 >> 8);
      sendbuf->base[sVar5 + 1] = (uint8_t)(sVar7 - sVar4);
      uVar1 = ppVar2[1].type;
      ppVar2 = ppVar2 + 1;
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}